

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O2

void Saig_ObjDualFanin(Aig_Man_t *pAigNew,Vec_Ptr_t *vCopies,Aig_Obj_t *pObj,int iFanin,
                      Aig_Obj_t **ppRes0,Aig_Obj_t **ppRes1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  int iVar3;
  Aig_Obj_t **ppAVar4;
  
  if ((uint)iFanin < 2) {
    if (iFanin == 0) {
      pAVar1 = pObj->pFanin0;
      ppAVar4 = &pObj->pFanin0;
    }
    else {
      pAVar1 = pObj->pFanin1;
      ppAVar4 = &pObj->pFanin1;
    }
    if (pAVar1 == (Aig_Obj_t *)0x0) {
      iVar3 = -2;
    }
    else {
      iVar3 = *(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24) * 2;
    }
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vCopies,iVar3);
    if (*ppAVar4 == (Aig_Obj_t *)0x0) {
      iVar3 = -1;
    }
    else {
      iVar3 = *(int *)(((ulong)*ppAVar4 & 0xfffffffffffffffe) + 0x24);
    }
    pAVar2 = Saig_ObjDual(vCopies,iVar3,1);
    if (((ulong)*ppAVar4 & 1) == 0) {
      *ppRes0 = pAVar1;
    }
    else {
      p1 = Aig_Or(pAigNew,pAVar1,pAVar2);
      pAVar2 = Aig_And(pAigNew,pAVar2,p1);
      *ppRes0 = pAVar2;
      pAVar2 = Aig_And(pAigNew,pAVar1,p1);
    }
    *ppRes1 = pAVar2;
    return;
  }
  __assert_fail("iFanin == 0 || iFanin == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                ,0x25,
                "void Saig_ObjDualFanin(Aig_Man_t *, Vec_Ptr_t *, Aig_Obj_t *, int, Aig_Obj_t **, Aig_Obj_t **)"
               );
}

Assistant:

static inline void        Saig_ObjDualFanin( Aig_Man_t * pAigNew, Vec_Ptr_t * vCopies, Aig_Obj_t * pObj, int iFanin, Aig_Obj_t ** ppRes0, Aig_Obj_t ** ppRes1 ) {

    Aig_Obj_t * pTemp0, * pTemp1, * pCare;
    int fCompl;
    assert( iFanin == 0 || iFanin == 1 );
    if ( iFanin == 0 )
    {
        pTemp0 = Saig_ObjDual( vCopies, Aig_ObjFaninId0(pObj), 0 );
        pTemp1 = Saig_ObjDual( vCopies, Aig_ObjFaninId0(pObj), 1 );
        fCompl = Aig_ObjFaninC0( pObj );
    }
    else
    {
        pTemp0 = Saig_ObjDual( vCopies, Aig_ObjFaninId1(pObj), 0 );
        pTemp1 = Saig_ObjDual( vCopies, Aig_ObjFaninId1(pObj), 1 );
        fCompl = Aig_ObjFaninC1( pObj );
    }
    if ( fCompl )
    {
        pCare   = Aig_Or( pAigNew, pTemp0, pTemp1 );
        *ppRes0 = Aig_And( pAigNew, pTemp1, pCare );
        *ppRes1 = Aig_And( pAigNew, pTemp0, pCare );
    }
    else
    {
        *ppRes0 = pTemp0;
        *ppRes1 = pTemp1;
    }
}